

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O3

size_t __thiscall baryonyx::bit_array_hash::operator()(bit_array_hash *this,bit_array *array)

{
  unsigned_long *puVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar2 = (array->super_bit_array_impl).m_block_size;
  if ((ulong)uVar2 == 0) {
    sVar3 = 0;
  }
  else {
    if ((~((int)uVar2 >> 0x1f) & uVar2) <= uVar2 - 1) {
      operator()(this);
    }
    sVar3 = 0;
    uVar4 = 0;
    do {
      puVar1 = (array->super_bit_array_impl).m_data._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + uVar4;
      uVar4 = uVar4 + 1;
      sVar3 = (sVar3 >> 2) + sVar3 * 0x40 + *puVar1 + 0x9e3779b9 ^ sVar3;
    } while (uVar2 != uVar4);
  }
  return sVar3;
}

Assistant:

std::size_t operator()(const bit_array& array) const noexcept
    {
        std::size_t ret{ 0 };

        for (int i = 0, e = array.block_size(); i != e; ++i)
            ret ^=
              std::hash<bit_array_impl::underlying_type>()(array.block(i)) +
              0x9e3779b9 + (ret << 6) + (ret >> 2);

        return ret;
    }